

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t FASTCOVER_hashPtrToIndex(void *p,U32 f,uint d)

{
  size_t sVar1;
  
  if (d == 6) {
    sVar1 = ZSTD_hash6Ptr(p,f);
    return sVar1;
  }
  if (f < 0x41) {
    return (ulong)(*p * -0x30e44323485a9b9d) >> (-(char)f & 0x3fU);
  }
  __assert_fail("h <= 64",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x4726,"size_t ZSTD_hash8(U64, U32, U64)");
}

Assistant:

static size_t FASTCOVER_hashPtrToIndex(const void* p, U32 f, unsigned d) {
  if (d == 6) {
    return ZSTD_hash6Ptr(p, f);
  }
  return ZSTD_hash8Ptr(p, f);
}